

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O2

FFSTypeHandle_conflict FFSset_fixed_target(FFSContext c,FMStructDescList struct_list)

{
  FMFormat_conflict p_Var1;
  FFSTypeHandle_conflict p_Var2;
  ulong uVar3;
  ulong uVar4;
  
  p_Var1 = register_data_format(c->fmc,struct_list);
  p_Var2 = FFSTypeHandle_by_index(c,p_Var1->format_index);
  p_Var2->is_fixed_target = 1;
  uVar4 = 0;
  uVar3 = (ulong)(uint)c->handle_list_size;
  if (c->handle_list_size < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    if (c->handle_list[uVar4] != (FFSTypeHandle_conflict)0x0) {
      c->handle_list[uVar4]->status = not_checked;
    }
  }
  return p_Var2;
}

Assistant:

extern FFSTypeHandle
FFSset_fixed_target(FFSContext c, FMStructDescList struct_list)
{
    FMFormat fmf = register_data_format(c->fmc, struct_list);
    int index;
    FFSTypeHandle handle;
    index = fmf->format_index;
    handle = FFSTypeHandle_by_index(c, index);
    handle->is_fixed_target = 1;
    /* any new target may invalidate prior conversion decisions */
    reset_prior_conversions(c);
    return handle;
}